

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TFunction * __thiscall
glslang::HlslParseContext::findPatchConstantFunction(HlslParseContext *this,TSourceLoc *loc)

{
  bool bVar1;
  pointer pcVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  bool builtIn;
  TString mangledName;
  bool local_69;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_68;
  TVector<const_glslang::TFunction_*> local_40;
  
  bVar1 = TSymbolTable::isFunctionNameVariable
                    ((this->super_TParseContextBase).symbolTable,&this->patchConstantFunctionName);
  if (bVar1) {
    pcVar2 = (this->patchConstantFunctionName)._M_dataplus._M_p;
    pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar3 = "can\'t use variable in patch constant function";
  }
  else {
    local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    pcVar2 = (this->patchConstantFunctionName)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_68,pcVar2,pcVar2 + (this->patchConstantFunctionName)._M_string_length
                       );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&local_68,"(");
    local_40.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
    local_40.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TSymbolTable::findFunctionNameList
              ((this->super_TParseContextBase).symbolTable,&local_68,&local_40,&local_69);
    if (local_40.
        super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        .
        super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_40.
        super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        .
        super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar2 = (this->patchConstantFunctionName)._M_dataplus._M_p;
      pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = "patch constant function not found";
    }
    else {
      if ((ulong)((long)local_40.
                        super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                        .
                        super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_40.
                       super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                       .
                       super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 9) {
        return *local_40.
                super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                .
                super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar2 = (this->patchConstantFunctionName)._M_dataplus._M_p;
      pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar3 = "ambiguous patch constant function";
    }
  }
  (*pp_Var4[0x2d])(this,loc,pcVar3,pcVar2,"");
  return (TFunction *)0x0;
}

Assistant:

const TFunction* HlslParseContext::findPatchConstantFunction(const TSourceLoc& loc)
{
    if (symbolTable.isFunctionNameVariable(patchConstantFunctionName)) {
        error(loc, "can't use variable in patch constant function", patchConstantFunctionName.c_str(), "");
        return nullptr;
    }

    const TString mangledName = patchConstantFunctionName + "(";

    // create list of PCF candidates
    TVector<const TFunction*> candidateList;
    bool builtIn;
    symbolTable.findFunctionNameList(mangledName, candidateList, builtIn);

    // We have to have one and only one, or we don't know which to pick: the patchconstantfunc does not
    // allow any disambiguation of overloads.
    if (candidateList.empty()) {
        error(loc, "patch constant function not found", patchConstantFunctionName.c_str(), "");
        return nullptr;
    }

    // Based on directed experiments, it appears that if there are overloaded patchconstantfunctions,
    // HLSL picks the last one in shader source order.  Since that isn't yet implemented here, error
    // out if there is more than one candidate.
    if (candidateList.size() > 1) {
        error(loc, "ambiguous patch constant function", patchConstantFunctionName.c_str(), "");
        return nullptr;
    }

    return candidateList[0];
}